

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O1

void __thiscall
tf::Executor::_schedule<tf::Node**>(Executor *this,Worker *worker,Node **first,Node **last)

{
  Node *o;
  pointer pBVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  pthread_mutex_t *__mutex;
  Node *node;
  __base_type local_50;
  size_t local_48;
  anon_class_16_2_3fe397bd local_40;
  
  if ((long)last - (long)first != 0) {
    local_48 = (long)last - (long)first >> 3;
    if (worker->_executor != this) {
      lVar5 = local_48 + (local_48 == 0);
      lVar4 = 0;
      do {
        o = first[lVar4];
        pBVar1 = (this->_buffers)._buckets.
                 super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar3 = (ulong)o %
                (ulong)(((long)(this->_buffers)._buckets.
                               super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 7) *
                       -0x5555555555555555);
        __mutex = (pthread_mutex_t *)(pBVar1 + uVar3);
        iVar2 = pthread_mutex_lock(__mutex);
        if (iVar2 != 0) {
          std::__throw_system_error(iVar2);
        }
        UnboundedTaskQueue<tf::Node_*>::push
                  (&(this->_buffers)._buckets.
                    super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar3].queue,o);
        pthread_mutex_unlock(__mutex);
        lVar4 = lVar4 + 1;
      } while (lVar5 != lVar4);
      NonblockingNotifierV2::notify_n(&this->_notifier,local_48);
      return;
    }
    lVar4 = 0;
    do {
      local_50._M_p = first[lVar4];
      local_40.node = &local_50._M_p;
      uVar3 = (worker->_wsq)._bottom.super___atomic_base<long>._M_i;
      local_40.this = this;
      if ((long)(uVar3 - (worker->_wsq)._top.super___atomic_base<long>._M_i) < 0x100) {
        (worker->_wsq)._buffer[uVar3 & 0xff]._M_b._M_p = local_50._M_p;
        (worker->_wsq)._bottom.super___atomic_base<long>._M_i = uVar3 + 1;
      }
      else {
        _schedule<tf::Node_**>::anon_class_16_2_3fe397bd::operator()(&local_40);
      }
      NonblockingNotifierV2::_notify<false>(&this->_notifier);
      lVar4 = lVar4 + 1;
    } while (local_48 + (local_48 == 0) != lVar4);
  }
  return;
}

Assistant:

void Executor::_schedule(Worker& worker, I first, I last) {

  size_t num_nodes = last - first;
  
  if(num_nodes == 0) {
    return;
  }
  
  // NOTE: We cannot use first/last in the for-loop (e.g., for(; first != last; ++first)).
  // This is because when a node v is inserted into the queue, v can run and finish 
  // immediately. If v is the last node in the graph, it will tear down the parent task vector
  // which cause the last ++first to fail. This problem is specific to MSVC which has a stricter
  // iterator implementation in std::vector than GCC/Clang.
  if(worker._executor == this) {
    for(size_t i=0; i<num_nodes; i++) {
      auto node = detail::get_node_ptr(first[i]);
      worker._wsq.push(node, [&](){ _buffers.push(node); });
      _notifier.notify_one();
    }
    return;
  }
  
  for(size_t i=0; i<num_nodes; i++) {
    _buffers.push(detail::get_node_ptr(first[i]));
  }
  _notifier.notify_n(num_nodes);
}